

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
::iterator::operator*(iterator *this)

{
  AssertIsFull(this->ctrl_,'\0',(GenerationType *)0x0,"operator*()");
  return (this->field_1).slot_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }